

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t
exr_initialize_required_attr_simple
          (exr_context_t ctxt,int part_index,int32_t width,int32_t height,exr_compression_t ctype)

{
  exr_result_t eVar1;
  exr_attr_v2f_t swc;
  exr_attr_box2i_t dispWindow;
  exr_attr_v2f_t local_18;
  exr_attr_box2i_t local_10;
  
  local_10.min.x = 0;
  local_10.min.y = 0;
  local_10.max.x = width + -1;
  local_10.max.y = height + -1;
  local_18.x = 0.0;
  local_18.y = 0.0;
  eVar1 = exr_initialize_required_attr
                    (ctxt,part_index,&local_10,&local_10,1.0,&local_18,1.0,
                     EXR_LINEORDER_INCREASING_Y,ctype);
  return eVar1;
}

Assistant:

exr_result_t
exr_initialize_required_attr_simple (
    exr_context_t     ctxt,
    int               part_index,
    int32_t           width,
    int32_t           height,
    exr_compression_t ctype)
{
    exr_attr_box2i_t dispWindow = {
        .min = {.x = 0, .y = 0}, .max = {.x = (width - 1), .y = (height - 1)}};
    exr_attr_v2f_t swc = {.x = 0.f, .y = 0.f};
    return exr_initialize_required_attr (
        ctxt,
        part_index,
        &dispWindow,
        &dispWindow,
        1.f,
        &swc,
        1.f,
        EXR_LINEORDER_INCREASING_Y,
        ctype);
}